

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenFaceNormalsProcess.cpp
# Opt level: O1

bool __thiscall
Assimp::GenFaceNormalsProcess::GenMeshFaceNormals(GenFaceNormalsProcess *this,aiMesh *pMesh)

{
  aiFace *paVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  aiVector3D *paVar5;
  uint *puVar6;
  aiVector3D *paVar7;
  ulong uVar8;
  Logger *this_00;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  if (pMesh->mNormals != (aiVector3D *)0x0) {
    if (this->force_ != true) {
      return false;
    }
    operator_delete__(pMesh->mNormals);
  }
  if ((pMesh->mPrimitiveTypes & 0xc) == 0) {
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Normal vectors are undefined for line and point meshes");
    return false;
  }
  uVar2 = pMesh->mNumVertices;
  paVar7 = (aiVector3D *)operator_new__((ulong)uVar2 * 0xc);
  if (uVar2 != 0) {
    memset(paVar7,0,(((ulong)uVar2 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  pMesh->mNormals = paVar7;
  if (pMesh->mNumFaces != 0) {
    uVar9 = 0;
    do {
      paVar1 = pMesh->mFaces + uVar9;
      uVar2 = pMesh->mFaces[uVar9].mNumIndices;
      if (uVar2 < 3) {
        if (paVar1->mNumIndices != 0) {
          uVar8 = 0;
          do {
            paVar5 = pMesh->mNormals;
            uVar2 = paVar1->mIndices[uVar8];
            paVar7 = paVar5 + uVar2;
            paVar7->x = NAN;
            paVar7->y = NAN;
            paVar5[uVar2].z = NAN;
            uVar8 = uVar8 + 1;
          } while (uVar8 < paVar1->mNumIndices);
        }
      }
      else {
        paVar7 = pMesh->mVertices;
        puVar6 = paVar1->mIndices;
        uVar3 = *puVar6;
        uVar4 = puVar6[1];
        uVar2 = puVar6[uVar2 - 1];
        fVar10 = paVar7[uVar4].x - paVar7[uVar3].x;
        fVar11 = paVar7[uVar4].y - paVar7[uVar3].y;
        fVar16 = paVar7[uVar4].z - paVar7[uVar3].z;
        fVar14 = paVar7[uVar2].x - paVar7[uVar3].x;
        fVar15 = paVar7[uVar2].y - paVar7[uVar3].y;
        fVar12 = paVar7[uVar2].z - paVar7[uVar3].z;
        fVar13 = fVar11 * fVar12 - fVar15 * fVar16;
        fVar12 = fVar16 * fVar14 - fVar12 * fVar10;
        fVar11 = fVar15 * fVar10 - fVar14 * fVar11;
        fVar10 = fVar11 * fVar11 + fVar13 * fVar13 + fVar12 * fVar12;
        if (fVar10 < 0.0) {
          fVar10 = sqrtf(fVar10);
        }
        else {
          fVar10 = SQRT(fVar10);
        }
        if (0.0 < fVar10) {
          fVar10 = 1.0 / fVar10;
          fVar13 = fVar13 * fVar10;
          fVar12 = fVar12 * fVar10;
          fVar11 = fVar11 * fVar10;
        }
        if (paVar1->mNumIndices != 0) {
          uVar8 = 0;
          do {
            paVar5 = pMesh->mNormals;
            uVar2 = paVar1->mIndices[uVar8];
            paVar7 = paVar5 + uVar2;
            paVar7->x = fVar13;
            paVar7->y = fVar12;
            paVar5[uVar2].z = fVar11;
            uVar8 = uVar8 + 1;
          } while (uVar8 < paVar1->mNumIndices);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < pMesh->mNumFaces);
    return true;
  }
  return true;
}

Assistant:

bool GenFaceNormalsProcess::GenMeshFaceNormals (aiMesh* pMesh)
{
    if (NULL != pMesh->mNormals) {
        if (force_) delete[] pMesh->mNormals;
        else return false;
    }

    // If the mesh consists of lines and/or points but not of
    // triangles or higher-order polygons the normal vectors
    // are undefined.
    if (!(pMesh->mPrimitiveTypes & (aiPrimitiveType_TRIANGLE | aiPrimitiveType_POLYGON)))   {
        ASSIMP_LOG_INFO("Normal vectors are undefined for line and point meshes");
        return false;
    }

    // allocate an array to hold the output normals
    pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
    const float qnan = get_qnan();

    // iterate through all faces and compute per-face normals but store them per-vertex.
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
        const aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices < 3)   {
            // either a point or a line -> no well-defined normal vector
            for (unsigned int i = 0;i < face.mNumIndices;++i) {
                pMesh->mNormals[face.mIndices[i]] = aiVector3D(qnan);
            }
            continue;
        }

        const aiVector3D* pV1 = &pMesh->mVertices[face.mIndices[0]];
        const aiVector3D* pV2 = &pMesh->mVertices[face.mIndices[1]];
        const aiVector3D* pV3 = &pMesh->mVertices[face.mIndices[face.mNumIndices-1]];
        const aiVector3D vNor = ((*pV2 - *pV1) ^ (*pV3 - *pV1)).NormalizeSafe();

        for (unsigned int i = 0;i < face.mNumIndices;++i) {
            pMesh->mNormals[face.mIndices[i]] = vNor;
        }
    }
    return true;
}